

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadowValue.cpp
# Opt level: O1

string * __thiscall
ShadowValue::getCSVformat_abi_cxx11_(string *__return_storage_ptr__,ShadowValue *this)

{
  undefined8 *puVar1;
  size_type *psVar2;
  bool bVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong *puVar8;
  char cVar9;
  undefined8 uVar10;
  ulong uVar11;
  string __str_1;
  string __str;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140 [2];
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  uVar11 = this->__index;
  cVar9 = '\x01';
  if (9 < uVar11) {
    uVar7 = uVar11;
    cVar4 = '\x04';
    do {
      cVar9 = cVar4;
      if (uVar7 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_001441a9;
      }
      if (uVar7 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_001441a9;
      }
      if (uVar7 < 10000) goto LAB_001441a9;
      bVar3 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar4 = cVar9 + '\x04';
    } while (bVar3);
    cVar9 = cVar9 + '\x01';
  }
LAB_001441a9:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,uVar11);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_260 = *puVar8;
    lStack_258 = plVar5[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *puVar8;
    local_270 = (ulong *)*plVar5;
  }
  local_268 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_70,vsnprintf,0x148,"%f",SUB84(this->__argument,0));
  uVar11 = 0xf;
  if (local_270 != &local_260) {
    uVar11 = local_260;
  }
  if (uVar11 < local_70._M_string_length + local_268) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar10 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_70._M_string_length + local_268) goto LAB_001442a1;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_270);
  }
  else {
LAB_001442a1:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_70._M_dataplus._M_p);
  }
  local_1f0 = &local_1e0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_1e0 = *puVar1;
    uStack_1d8 = puVar6[3];
  }
  else {
    local_1e0 = *puVar1;
    local_1f0 = (undefined8 *)*puVar6;
  }
  local_1e8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_240 = *puVar8;
    lStack_238 = plVar5[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar8;
    local_250 = (ulong *)*plVar5;
  }
  local_248 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_90,vsnprintf,0x148,"%f",SUB84(this->__doubleP,0));
  uVar11 = 0xf;
  if (local_250 != &local_240) {
    uVar11 = local_240;
  }
  if (uVar11 < local_90._M_string_length + local_248) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar10 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_90._M_string_length + local_248) goto LAB_001443e8;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_250);
  }
  else {
LAB_001443e8:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_90._M_dataplus._M_p);
  }
  local_1d0 = &local_1c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_1c0 = *puVar1;
    uStack_1b8 = puVar6[3];
  }
  else {
    local_1c0 = *puVar1;
    local_1d0 = (undefined8 *)*puVar6;
  }
  local_1c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_220 = *puVar8;
    lStack_218 = plVar5[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar8;
    local_230 = (ulong *)*plVar5;
  }
  local_228 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_b0,vsnprintf,0x148,"%f",SUB84(this->__singleP,0));
  uVar11 = 0xf;
  if (local_230 != &local_220) {
    uVar11 = local_220;
  }
  if (uVar11 < local_b0._M_string_length + local_228) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar10 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_b0._M_string_length + local_228) goto LAB_00144530;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_230);
  }
  else {
LAB_00144530:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_b0._M_dataplus._M_p);
  }
  local_1b0 = &local_1a0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_1a0 = *puVar1;
    uStack_198 = puVar6[3];
  }
  else {
    local_1a0 = *puVar1;
    local_1b0 = (undefined8 *)*puVar6;
  }
  local_1a8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_200 = *puVar8;
    lStack_1f8 = plVar5[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar8;
    local_210 = (ulong *)*plVar5;
  }
  local_208 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_d0,vsnprintf,0x148,"%f",SUB84(this->__doubleP - this->__singleP,0));
  uVar11 = 0xf;
  if (local_210 != &local_200) {
    uVar11 = local_200;
  }
  if (uVar11 < local_d0._M_string_length + local_208) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar10 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_d0._M_string_length + local_208) goto LAB_00144685;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_210);
  }
  else {
LAB_00144685:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_d0._M_dataplus._M_p);
  }
  local_190 = &local_180;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_180 = *puVar1;
    uStack_178 = puVar6[3];
  }
  else {
    local_180 = *puVar1;
    local_190 = (undefined8 *)*puVar6;
  }
  local_188 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_120 = *puVar8;
    lStack_118 = plVar5[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar8;
    local_130 = (ulong *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_f0,vsnprintf,0x148,"%f",
             SUB84(ABS(this->__doubleP - this->__singleP) / this->__doubleP,0));
  uVar11 = 0xf;
  if (local_130 != &local_120) {
    uVar11 = local_120;
  }
  if (uVar11 < local_f0._M_string_length + local_128) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar10 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_f0._M_string_length + local_128) goto LAB_001447f9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_001447f9:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0._M_dataplus._M_p);
  }
  local_170 = &local_160;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_160 = *puVar1;
    uStack_158 = puVar6[3];
  }
  else {
    local_160 = *puVar1;
    local_170 = (undefined8 *)*puVar6;
  }
  local_168 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_100 = *puVar8;
    lStack_f8 = plVar5[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar8;
    local_110 = (ulong *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  bVar3 = this->__spBoolean;
  local_150 = local_140;
  std::__cxx11::string::_M_construct((ulong)&local_150,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_150,1,(uint)bVar3);
  uVar11 = 0xf;
  if (local_110 != &local_100) {
    uVar11 = local_100;
  }
  if (uVar11 < (ulong)(local_148 + local_108)) {
    uVar11 = 0xf;
    if (local_150 != local_140) {
      uVar11 = local_140[0];
    }
    if ((ulong)(local_148 + local_108) <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_110);
      goto LAB_00144995;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_150);
LAB_00144995:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar2) {
    uVar10 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar2;
  puVar6[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string ShadowValue::getCSVformat(){
    return to_string(__index) + " "
#ifdef USE_TIMESTAMP
        + to_string(__timeStamp) + " "
#endif
        + to_string(__argument) + " "
        + to_string(__doubleP) + " "
        + to_string(__singleP) + " "
        + to_string(abs(__doubleP - __singleP)) + " "
        + to_string(abs(__doubleP - __singleP)/__doubleP) + " "
        + to_string(__spBoolean);
}